

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::attachDocComment(Builder statement,Array<kj::String> *comment)

{
  Array<kj::String> *__dest;
  bool bVar1;
  String *pSVar2;
  size_t sVar3;
  char *__src;
  undefined1 *puVar4;
  Fault local_b8;
  Fault f;
  char **local_a8;
  undefined1 local_a0 [8];
  DebugComparison<char_*&,_char_*> _kjCondition;
  String *line_1;
  String *__end2_1;
  String *__begin2_1;
  Array<kj::String> *__range2_1;
  char *pos;
  Builder builder;
  String *line;
  String *__end2;
  String *__begin2;
  Array<kj::String> *__range2;
  size_t size;
  Array<kj::String> *comment_local;
  
  __range2 = (Array<kj::String> *)0x0;
  __end2 = kj::Array<kj::String>::begin(comment);
  pSVar2 = kj::Array<kj::String>::end(comment);
  for (; __end2 != pSVar2; __end2 = __end2 + 1) {
    builder.content.size_ = (size_t)__end2;
    sVar3 = kj::String::size(__end2);
    __range2 = (Array<kj::String> *)((long)&__range2->ptr + sVar3 + 1);
  }
  Statement::Builder::initDocComment((Builder *)&pos,&statement,(uint)__range2);
  __range2_1 = (Array<kj::String> *)Text::Builder::begin((Builder *)&pos);
  __end2_1 = kj::Array<kj::String>::begin(comment);
  pSVar2 = kj::Array<kj::String>::end(comment);
  for (; __dest = __range2_1, __end2_1 != pSVar2; __end2_1 = __end2_1 + 1) {
    _kjCondition._32_8_ = __end2_1;
    __src = kj::String::begin(__end2_1);
    sVar3 = kj::String::size((String *)_kjCondition._32_8_);
    memcpy(__dest,__src,sVar3);
    sVar3 = kj::String::size((String *)_kjCondition._32_8_);
    puVar4 = (undefined1 *)((long)&__range2_1->ptr + sVar3);
    __range2_1 = (Array<kj::String> *)(puVar4 + 1);
    *puVar4 = 10;
  }
  local_a8 = (char **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char **)&__range2_1);
  f.exception = (Exception *)Text::Builder::end((Builder *)&pos);
  kj::_::DebugExpression<char*&>::operator==
            ((DebugComparison<char_*&,_char_*> *)local_a0,(DebugExpression<char*&> *)&local_a8,
             (char **)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/lexer.c++"
               ,0x6d,FAILED,"pos == builder.end()","_kjCondition,",
               (DebugComparison<char_*&,_char_*> *)local_a0);
    kj::_::Debug::Fault::fatal(&local_b8);
  }
  return;
}

Assistant:

void attachDocComment(Statement::Builder statement, kj::Array<kj::String>&& comment) {
  size_t size = 0;
  for (auto& line: comment) {
    size += line.size() + 1;  // include newline
  }
  Text::Builder builder = statement.initDocComment(size);
  char* pos = builder.begin();
  for (auto& line: comment) {
    memcpy(pos, line.begin(), line.size());
    pos += line.size();
    *pos++ = '\n';
  }
  KJ_ASSERT(pos == builder.end());
}